

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O1

in_addr_t ngx_inet_addr(u_char *text,size_t len)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  byte *pbVar6;
  bool bVar7;
  
  if ((long)len < 1) {
    iVar2 = 0;
    uVar4 = 0;
    bVar7 = false;
  }
  else {
    pbVar6 = text + len;
    lVar5 = 0;
    uVar4 = 0;
    iVar2 = 0;
    do {
      bVar1 = *text;
      if ((byte)(bVar1 - 0x30) < 10) {
        uVar4 = (ulong)(bVar1 & 0xf) + uVar4 * 10;
        if (0xff < uVar4) goto LAB_00118f15;
      }
      else {
        if (bVar1 != 0x2e) goto LAB_00118f15;
        iVar2 = (int)uVar4 + iVar2 * 0x100;
        lVar5 = lVar5 + 1;
        uVar4 = 0;
      }
      text = text + 1;
    } while (text < pbVar6);
    bVar7 = lVar5 == 3;
    iVar2 = iVar2 << 8;
  }
  if (bVar7) {
    uVar3 = iVar2 + (int)uVar4;
    uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | (int)uVar4 * 0x1000000
    ;
  }
  else {
LAB_00118f15:
    uVar3 = 0xffffffff;
  }
  return uVar3;
}

Assistant:

in_addr_t
ngx_inet_addr(u_char *text, size_t len)
{
    u_char      *p, c;
    in_addr_t    addr;
    ngx_uint_t   octet, n;

    addr = 0;
    octet = 0;
    n = 0;

    for (p = text; p < text + len; p++) {
        c = *p;

        if (c >= '0' && c <= '9') {
            octet = octet * 10 + (c - '0');

            if (octet > 255) {
                return INADDR_NONE;
            }

            continue;
        }

        if (c == '.') {
            addr = (addr << 8) + octet;
            octet = 0;
            n++;
            continue;
        }

        return INADDR_NONE;
    }

    if (n == 3) {
        addr = (addr << 8) + octet;
        return htonl(addr);
    }

    return INADDR_NONE;
}